

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void xmlHashFree(xmlHashTablePtr table,xmlHashDeallocator f)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  int iVar3;
  long lVar4;
  _xmlHashEntry *p_Var5;
  bool bVar6;
  
  if (table != (xmlHashTablePtr)0x0) {
    p_Var5 = table->table;
    if (p_Var5 != (_xmlHashEntry *)0x0) {
      iVar2 = table->size;
      iVar3 = table->nbElems;
      if (0 < iVar3 && 0 < iVar2) {
        lVar4 = 0;
        do {
          p_Var5 = table->table;
          if (p_Var5 != (_xmlHashEntry *)0x0 && p_Var5[lVar4].valid != 0) {
            bVar6 = false;
            p_Var5 = p_Var5 + lVar4;
            do {
              p_Var1 = p_Var5->next;
              if ((f != (xmlHashDeallocator)0x0) && (p_Var5->payload != (void *)0x0)) {
                (*f)(p_Var5->payload,p_Var5->name);
              }
              if (table->dict == (xmlDictPtr)0x0) {
                if (p_Var5->name != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var5->name);
                }
                if (p_Var5->name2 != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var5->name2);
                }
                if (p_Var5->name3 != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var5->name3);
                }
              }
              p_Var5->payload = (void *)0x0;
              if (bVar6) {
                (*xmlFree)(p_Var5);
              }
              iVar3 = iVar3 + -1;
              bVar6 = true;
              p_Var5 = p_Var1;
            } while (p_Var1 != (_xmlHashEntry *)0x0);
            iVar2 = table->size;
          }
          lVar4 = lVar4 + 1;
        } while ((lVar4 < iVar2) && (0 < iVar3));
        p_Var5 = table->table;
      }
      (*xmlFree)(p_Var5);
    }
    if (table->dict != (xmlDictPtr)0x0) {
      xmlDictFree(table->dict);
    }
    (*xmlFree)(table);
    return;
  }
  return;
}

Assistant:

void
xmlHashFree(xmlHashTablePtr table, xmlHashDeallocator f) {
    int i;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;
    int inside_table = 0;
    int nbElems;

    if (table == NULL)
	return;
    if (table->table) {
	nbElems = table->nbElems;
	for(i = 0; (i < table->size) && (nbElems > 0); i++) {
	    iter = &(table->table[i]);
	    if (iter->valid == 0)
		continue;
	    inside_table = 1;
	    while (iter) {
		next = iter->next;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, iter->name);
		if (table->dict == NULL) {
		    if (iter->name)
			xmlFree(iter->name);
		    if (iter->name2)
			xmlFree(iter->name2);
		    if (iter->name3)
			xmlFree(iter->name3);
		}
		iter->payload = NULL;
		if (!inside_table)
		    xmlFree(iter);
		nbElems--;
		inside_table = 0;
		iter = next;
	    }
	}
	xmlFree(table->table);
    }
    if (table->dict)
        xmlDictFree(table->dict);
    xmlFree(table);
}